

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomLayout::read(DomLayout *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomProperty *this_00;
  DomLayoutItem *this_01;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_02;
  QList<DomProperty_*> *this_03;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_02 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  lVar5 = 0;
  pQVar4 = local_50.ptr;
  while( true ) {
    if (local_50.size * 0x68 == lVar5) break;
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"class",5);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeClass(this,(QString *)&local_80);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"name",4);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (bVar1) {
        local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
        local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
        QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
        setAttributeName(this,(QString *)&local_80);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"stretch",7);
        local_98.a.m_size = local_80.size;
        local_98.a.m_data = (char *)local_80.ptr;
        bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (bVar1) {
          local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
          local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
          QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
          setAttributeStretch(this,(QString *)&local_80);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"rowstretch",10);
          local_98.a.m_size = local_80.size;
          local_98.a.m_data = (char *)local_80.ptr;
          bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (bVar1) {
            local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
            local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
            QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
            setAttributeRowStretch(this,(QString *)&local_80);
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"columnstretch",0xd);
            local_98.a.m_size = local_80.size;
            local_98.a.m_data = (char *)local_80.ptr;
            bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (bVar1) {
              local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
              local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
              QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
              setAttributeColumnStretch(this,(QString *)&local_80);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((QString *)&local_80,L"rowminimumheight",0x10);
              local_98.a.m_size = local_80.size;
              local_98.a.m_data = (char *)local_80.ptr;
              bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (bVar1) {
                local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
                local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
                QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
                setAttributeRowMinimumHeight(this,(QString *)&local_80);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((QString *)&local_80,L"columnminimumwidth",0x12);
                local_98.a.m_size = local_80.size;
                local_98.a.m_data = (char *)local_80.ptr;
                bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                if (bVar1) {
                  local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
                  local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
                  QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
                  setAttributeColumnMinimumWidth(this,(QString *)&local_80);
                }
                else {
                  local_98.a.m_size = 0x15;
                  local_98.a.m_data = "Unexpected attribute ";
                  local_98.b = &local_68;
                  QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                            ((QString *)&local_80,&local_98);
                  QXmlStreamReader::raiseError((QString *)this_02);
                }
              }
            }
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar4 = pQVar4 + 0x68;
    lVar5 = lVar5 + 0x68;
  }
LAB_001552fd:
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_02);
      if (bVar1) goto LAB_001554e4;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) break;
      if (iVar2 == 5) {
LAB_001554e4:
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(long *)(in_FS_OFFSET + 0x28);
      }
    }
    local_68.m_size = -0x5555555555555556;
    local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_68 = (QStringView)QXmlStreamReader::name();
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"property",8);
    sVar3 = 0;
    other.m_data = local_80.ptr;
    other.m_size = local_80.size;
    iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (iVar2 == 0) {
      this_00 = (DomProperty *)operator_new(0x178);
      memset(this_00,0,0x178);
      DomProperty::read(this_00,__fd,__buf_00,sVar3);
      this_03 = &this->m_property;
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"attribute",9);
      sVar3 = 0;
      other_00.m_data = local_80.ptr;
      other_00.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar2 != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"item",4);
        sVar3 = 0;
        other_01.m_data = local_80.ptr;
        other_01.m_size = local_80.size;
        iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (iVar2 == 0) {
          this_01 = (DomLayoutItem *)operator_new(0x58);
          this_01->m_attr_row = 0;
          this_01->m_has_attr_row = false;
          *(undefined3 *)&this_01->field_0x5 = 0;
          this_01->m_attr_column = 0;
          this_01->m_has_attr_column = false;
          *(undefined3 *)&this_01->field_0xd = 0;
          this_01->m_attr_rowSpan = 0;
          this_01->m_has_attr_rowSpan = false;
          *(undefined3 *)&this_01->field_0x15 = 0;
          this_01->m_attr_colSpan = 0;
          this_01->m_has_attr_colSpan = false;
          *(undefined3 *)&this_01->field_0x1d = 0;
          (this_01->m_attr_alignment).d.d = (Data *)0x0;
          (this_01->m_attr_alignment).d.ptr = (char16_t *)0x0;
          (this_01->m_attr_alignment).d.size = 0;
          this_01->m_has_attr_alignment = false;
          *(undefined3 *)&this_01->field_0x39 = 0;
          this_01->m_kind = Unknown;
          this_01->m_widget = (DomWidget *)0x0;
          this_01->m_layout = (DomLayout *)0x0;
          this_01->m_spacer = (DomSpacer *)0x0;
          DomLayoutItem::DomLayoutItem(this_01);
          DomLayoutItem::read(this_01,__fd,__buf_02,sVar3);
          QList<DomLayoutItem_*>::append(&this->m_item,this_01);
        }
        else {
          local_98.a.m_size = 0x13;
          local_98.a.m_data = "Unexpected element ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    ((QString *)&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)this_02);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        }
        goto LAB_001552fd;
      }
      this_00 = (DomProperty *)operator_new(0x178);
      memset(this_00,0,0x178);
      DomProperty::read(this_00,__fd,__buf_01,sVar3);
      this_03 = &this->m_attribute;
    }
    QList<DomProperty_*>::append(this_03,this_00);
  } while( true );
}

Assistant:

void DomLayout::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"class"_s) {
            setAttributeClass(attribute.value().toString());
            continue;
        }
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"stretch"_s) {
            setAttributeStretch(attribute.value().toString());
            continue;
        }
        if (name == u"rowstretch"_s) {
            setAttributeRowStretch(attribute.value().toString());
            continue;
        }
        if (name == u"columnstretch"_s) {
            setAttributeColumnStretch(attribute.value().toString());
            continue;
        }
        if (name == u"rowminimumheight"_s) {
            setAttributeRowMinimumHeight(attribute.value().toString());
            continue;
        }
        if (name == u"columnminimumwidth"_s) {
            setAttributeColumnMinimumWidth(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            if (!tag.compare(u"item"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutItem();
                v->read(reader);
                m_item.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}